

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall despot::util::tinyxml::TiXmlElement::TiXmlElement(TiXmlElement *this,char *_value)

{
  size_t len;
  
  (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
  (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
  (this->super_TiXmlNode).super_TiXmlBase.userData = (void *)0x0;
  (this->super_TiXmlNode).parent = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).value.rep_ = (Rep *)&TiXmlString::nullrep_;
  (this->super_TiXmlNode).type = ELEMENT;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).prev = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).next = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlElement_001914b0;
  TiXmlAttributeSet::TiXmlAttributeSet(&this->attributeSet);
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  len = strlen(_value);
  TiXmlString::assign(&(this->super_TiXmlNode).value,_value,len);
  return;
}

Assistant:

TiXmlElement::TiXmlElement(const char * _value) :
	TiXmlNode(TiXmlNode::ELEMENT) {
	firstChild = lastChild = 0;
	value = _value;
}